

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionList.cpp
# Opt level: O1

void __thiscall curlpp::internal::OptionList::~OptionList(OptionList *this)

{
  _Rb_tree_node_base *p_Var1;
  _Self __tmp;
  
  this->_vptr_OptionList = (_func_int **)&PTR__OptionList_00133d30;
  for (p_Var1 = (this->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->mOptions)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
    }
  }
  std::
  _Rb_tree<CURLoption,_std::pair<const_CURLoption,_curlpp::OptionBase_*>,_std::_Select1st<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>,_std::less<CURLoption>,_std::allocator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>_>
  ::~_Rb_tree(&(this->mOptions)._M_t);
  return;
}

Assistant:

OptionList::~OptionList()
{
  mapType::iterator pos = mOptions.begin();
  while (pos != mOptions.end()) {
    delete (*pos).second;
    pos++;
  }
}